

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrlp_util.cc
# Opt level: O1

CtrlPMatchMode __thiscall cpsm::parse_ctrlp_match_mode(cpsm *this,string_ref mmode)

{
  int iVar1;
  Error *this_00;
  CtrlPMatchMode CVar2;
  char *pcVar3;
  basic_string_ref<char,_std::char_traits<char>_> args_1;
  
  pcVar3 = mmode.ptr_;
  if ((long)pcVar3 < 0xd) {
    CVar2 = FULL_LINE;
    if (pcVar3 == (char *)0x0) {
      return FULL_LINE;
    }
    if (pcVar3 != (char *)0x9) goto LAB_0010d222;
    iVar1 = bcmp(this,"full-line",9);
  }
  else {
    if (pcVar3 == (char *)0xd) {
      iVar1 = bcmp(this,"filename-only",0xd);
      if (iVar1 == 0) {
        return FILENAME_ONLY;
      }
      iVar1 = bcmp(this,"first-non-tab",0xd);
      if (iVar1 == 0) {
        return FIRST_NON_TAB;
      }
    }
    if (pcVar3 != (char *)0xe) goto LAB_0010d222;
    iVar1 = bcmp(this,"until-last-tab",0xe);
    CVar2 = UNTIL_LAST_TAB;
  }
  if (iVar1 == 0) {
    return CVar2;
  }
LAB_0010d222:
  this_00 = (Error *)__cxa_allocate_exception(0x28);
  args_1.len_ = (size_t)pcVar3;
  args_1.ptr_ = (char *)this;
  Error::Error<char_const*,boost::basic_string_ref<char,std::char_traits<char>>>
            (this_00,"unknown match mode ",args_1);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

CtrlPMatchMode parse_ctrlp_match_mode(boost::string_ref const mmode) {
  if (mmode.empty() || mmode == "full-line") {
    return CtrlPMatchMode::FULL_LINE;
  } else if (mmode == "filename-only") {
    return CtrlPMatchMode::FILENAME_ONLY;
  } else if (mmode == "first-non-tab") {
    return CtrlPMatchMode::FIRST_NON_TAB;
  } else if (mmode == "until-last-tab") {
    return CtrlPMatchMode::UNTIL_LAST_TAB;
  }
  throw Error("unknown match mode ", mmode);
}